

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

int mp_snprint_ext_test(char *buf,int size,char **data,int depth)

{
  uint32_t uVar1;
  int iVar2;
  int8_t type;
  char *ext;
  char local_31;
  char *local_30;
  
  uVar1 = mp_decode_extl(data,&local_31);
  local_30 = *data;
  *data = local_30 + uVar1;
  if (local_31 == '\x01') {
    iVar2 = mp_snprint_recursion(buf,size,&local_30,depth);
  }
  else if (local_31 == '\0') {
    iVar2 = snprintf(buf,(long)size,"%.*s",(ulong)uVar1);
  }
  else {
    iVar2 = snprintf(buf,(long)size,"undefined");
  }
  return iVar2;
}

Assistant:

static int
mp_snprint_ext_test(char *buf, int size, const char **data, int depth)
{
	int8_t type;
	uint32_t len = mp_decode_extl(data, &type);
	const char *ext = *data;
	*data += len;
	switch(type) {
	case MP_EXT_TEST_PLAIN:
		return snprintf(buf, size, "%.*s", len, ext);
	case MP_EXT_TEST_MSGPACK:
		return mp_snprint_recursion(buf, size, &ext, depth);
	}
	return snprintf(buf, size, "undefined");
}